

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

VSubst<8UL> * __thiscall GF2::VSubst<8UL>::Rand(VSubst<8UL> *this)

{
  u32 uVar1;
  ulong uVar2;
  
  SetId(this);
  uVar2 = 0x100;
  while (uVar2 != 0) {
    uVar1 = Env::Rand();
    Transpose(this,uVar2 - 1,(ulong)uVar1 % uVar2);
    uVar2 = uVar2 - 1;
  }
  return this;
}

Assistant:

VSubst& Rand()
	{
		First();
		for (word x = _size; x != 0; x--)
			Transpose(x - 1, Env::Rand() % x);
		return *this;
	}